

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTarget(cmLocalGenerator *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  reference ppcVar3;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_b8;
  NamedGeneratorTargetFinder local_b0;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_90;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_88;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_80;
  const_iterator ti;
  NamedGeneratorTargetFinder local_68;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_48;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_40;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_38;
  const_iterator ai;
  _Self local_28;
  const_iterator i;
  string *name_local;
  cmLocalGenerator *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->AliasTargets,name);
  ai._M_current =
       (cmGeneratorTarget **)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->AliasTargets);
  bVar1 = std::operator!=(&local_28,(_Self *)&ai);
  if (bVar1) {
    local_40._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   (&this->GeneratorTargets);
    local_48._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   (&this->GeneratorTargets);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    NamedGeneratorTargetFinder::NamedGeneratorTargetFinder(&local_68,&ppVar2->second);
    local_38 = std::
               find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                         (local_40,local_48,&local_68);
    NamedGeneratorTargetFinder::~NamedGeneratorTargetFinder(&local_68);
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_38);
    this_local = (cmLocalGenerator *)*ppcVar3;
  }
  else {
    local_88._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   (&this->GeneratorTargets);
    local_90._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   (&this->GeneratorTargets);
    NamedGeneratorTargetFinder::NamedGeneratorTargetFinder(&local_b0,(string *)i._M_node);
    local_80 = std::
               find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                         (local_88,local_90,&local_b0);
    NamedGeneratorTargetFinder::~NamedGeneratorTargetFinder(&local_b0);
    local_b8._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                   (&this->GeneratorTargets);
    bVar1 = __gnu_cxx::operator!=(&local_80,&local_b8);
    if (bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_80);
      this_local = (cmLocalGenerator *)*ppcVar3;
    }
    else {
      this_local = (cmLocalGenerator *)0x0;
    }
  }
  return (cmGeneratorTarget *)this_local;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindGeneratorTarget(
    const std::string& name) const
{
  std::map<std::string, std::string>::const_iterator i =
      this->AliasTargets.find(name);
  if (i != this->AliasTargets.end())
    {
    std::vector<cmGeneratorTarget*>::const_iterator ai =
        std::find_if(this->GeneratorTargets.begin(),
                     this->GeneratorTargets.end(),
                     NamedGeneratorTargetFinder(i->second));
    return *ai;
    }
  std::vector<cmGeneratorTarget*>::const_iterator ti =
      std::find_if(this->GeneratorTargets.begin(),
                   this->GeneratorTargets.end(),
                   NamedGeneratorTargetFinder(name));
  if ( ti != this->GeneratorTargets.end() )
    {
    return *ti;
    }

  return 0;
}